

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

wchar_t borg_new_kill(uint r_idx,wchar_t y,wchar_t x)

{
  borg_kill *pbVar1;
  ushort uVar2;
  ushort uVar3;
  borg_grid *pbVar4;
  byte bVar5;
  int iVar6;
  chunk_conflict *c;
  monster_race *pmVar7;
  int16_t iVar8;
  wchar_t wVar9;
  _Bool _Var10;
  wchar_t wVar11;
  uint32_t uVar12;
  uint uVar13;
  int iVar14;
  loc grid;
  monster *pmVar15;
  char *pcVar16;
  int iVar17;
  int iVar18;
  borg_kill *pbVar19;
  ulong uVar20;
  wchar_t i;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  
  wVar11 = (wchar_t)borg_kills_nxt;
  if (wVar11 < L'\x02') {
    i = L'\xffffffff';
    bVar21 = 1;
  }
  else {
    pbVar19 = borg_kills + 1;
    i = L'\xffffffff';
    uVar25 = 2;
    do {
      wVar9 = (int)uVar25 + L'\xffffffff';
      if (pbVar19->r_idx != 0) {
        wVar9 = i;
      }
      i = wVar9;
      bVar5 = (byte)((uint)i >> 0x18);
      bVar21 = bVar5 >> 7;
      if (L'\xffffffff' < i) break;
      pbVar19 = pbVar19 + 1;
      bVar27 = uVar25 < (ulong)(long)wVar11;
      uVar25 = uVar25 + 1;
      bVar21 = bVar5 >> 7;
    } while (bVar27);
  }
  if (bVar21 == 1 && wVar11 < L'ÿ') {
    borg_kills_nxt = borg_kills_nxt + 1;
    i = wVar11;
  }
  if (i < L'\0') {
    borg_note("# Too many monsters");
    uVar12 = Rand_div((int)borg_kills_nxt - 1);
    i = uVar12 + L'\x02';
    borg_delete_kill(i);
  }
  c = cave;
  grid = (loc)loc(x,y);
  pmVar15 = square_monster(c,grid);
  pbVar19 = borg_kills;
  pmVar7 = r_info;
  if (pmVar15 == (monster *)0x0) {
    i = L'\xffffffff';
  }
  else {
    borg_kills_cnt = borg_kills_cnt + 1;
    pbVar1 = borg_kills + i;
    uVar2 = borg_kills[i].r_idx;
    pbVar4 = borg_grids[y];
    borg_kills[i].r_idx = (uint16_t)r_idx;
    pbVar19[i].pos.x = x;
    pbVar19[i].ox = (uint8_t)x;
    pbVar19[i].pos.y = y;
    pbVar19[i].oy = (uint8_t)y;
    pbVar19[i].m_idx = (int16_t)pmVar15->midx;
    pbVar4[x].kill = (uint8_t)i;
    iVar8 = borg_t;
    pbVar19[i].when = borg_t;
    if (borg_morgoth_id == (r_idx & 0xffff)) {
      borg_t_morgoth = iVar8;
    }
    borg_update_kill_new(i);
    borg_update_kill_old(i);
    uVar13 = (uint)pbVar1->r_idx;
    if (pbVar1->r_idx == 0) {
      pcVar16 = "dead monster";
    }
    else if ((int)uVar13 < (int)(z_info->r_max - 1)) {
      pcVar16 = r_info[uVar13].name;
    }
    else {
      pcVar16 = "player ghost";
    }
    pcVar16 = format("# Creating a monster \'%s\' at (%d,%d), HP: %d, Time: %d, Index: %d",pcVar16,
                     (ulong)(uint)(pbVar1->pos).y,(ulong)(uint)(pbVar1->pos).x,
                     (ulong)(uint)(int)pbVar1->power,(ulong)(uint)(int)pbVar1->when,uVar13);
    borg_note(pcVar16);
    borg_danger_wipe = true;
    if ((int)borg_t < borg.need_see_invis + 5) {
      iVar18 = borg.c.y >> 0x1f;
      iVar17 = borg.c.y / 0xb + iVar18;
      iVar14 = iVar17 - iVar18;
      iVar6 = borg.c.x >> 0x1f;
      iVar24 = borg.c.x / 0xb + iVar6;
      iVar26 = iVar24 - iVar6;
      iVar17 = (iVar17 + -1) - iVar18;
      if (borg.c.y < 0xb) {
        iVar17 = 0;
      }
      iVar18 = (iVar24 + -1) - iVar6;
      if (borg.c.x < 0xb) {
        iVar18 = 0;
      }
      uVar22 = (iVar24 + 1) - iVar6;
      uVar25 = 5;
      if (borg.c.x < 0x37) {
        uVar25 = (ulong)uVar22;
      }
      uVar23 = 0x11;
      if (borg.c.x < 0xbb) {
        uVar23 = uVar22;
      }
      borg_fear_region[iVar14][iVar26] = 0;
      borg_fear_region[iVar14][iVar18] = 0;
      borg_fear_region[iVar14][(int)uVar23] = 0;
      borg_fear_region[iVar17][iVar26] = 0;
      iVar24 = (int)uVar25;
      borg_fear_region[iVar24][iVar26] = 0;
      borg_fear_region[iVar17][iVar18] = 0;
      borg_fear_region[iVar17][(int)uVar23] = 0;
      borg_fear_region[iVar24][iVar18] = 0;
      borg_fear_region[iVar24][(int)uVar23] = 0;
      uVar3 = pbVar1->r_idx;
      if (uVar3 == 0) {
        pcVar16 = "dead monster";
      }
      else if ((int)(uint)uVar3 < (int)(z_info->r_max - 1)) {
        pcVar16 = r_info[(uint)uVar3].name;
      }
      else {
        pcVar16 = "player ghost";
      }
      pcVar16 = format("# Removing Regional Fear (%d,%d) because of a LOS %s",(ulong)(uint)y,
                       (ulong)(uint)x,pcVar16,uVar25,borg_fear_region,uVar13);
      borg_note(pcVar16);
    }
    if ((borg.trait[0x1a] != 0) &&
       (_Var10 = borg_los((pbVar1->pos).y,(pbVar1->pos).x,borg.c.y,borg.c.x), _Var10)) {
      borg.goal.type = 0;
    }
    pbVar4 = pbVar4 + x;
    _Var10 = flag_has_dbg(pmVar7[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (!_Var10) {
      pbVar4->feat = '\x01';
    }
    _Var10 = flag_has_dbg(pmVar7[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
    if (_Var10) {
      pbVar4->feat = '\x15';
    }
    pmVar7 = r_info;
    uVar25 = (ulong)borg_nasties_num;
    if (uVar25 != 0) {
      uVar20 = 0;
      do {
        if (pmVar7[pbVar1->r_idx].d_char == (int)borg_nasties[uVar20]) {
          borg_nasties_count[uVar20] = borg_nasties_count[uVar20] + '\x01';
        }
        uVar20 = uVar20 + 1;
      } while (uVar25 != uVar20);
    }
  }
  return i;
}

Assistant:

static int borg_new_kill(unsigned int r_idx, int y, int x)
{
    int i, n = -1;

    borg_kill           *kill;
    borg_grid           *ag;
    struct monster_race *r_ptr;
    struct monster      *m_ptr;

    /* Look for a "dead" monster */
    for (i = 1; (n < 0) && (i < borg_kills_nxt); i++) {
        /* Skip real entries */
        if (!borg_kills[i].r_idx)
            n = i;
    }

    /* Allocate a new monster */
    if ((n < 0) && (borg_kills_nxt < 255)) {
        /* Acquire the entry, advance */
        n = borg_kills_nxt++;
    }

    /* Hack -- steal an old monster */
    if (n < 0) {
        /* Note */
        borg_note("# Too many monsters");

        /* Hack -- Pick a random monster */
        n = randint1(borg_kills_nxt - 1) + 1;

        /* Kill it */
        borg_delete_kill(n);
    }

    /* it might be that it can't be found */
    m_ptr = square_monster(cave, loc(x, y));
    if (!m_ptr)
        return -1;

    /* Count the monsters */
    borg_kills_cnt++;

    /* Access the monster */
    kill  = &borg_kills[n];
    r_ptr = &r_info[kill->r_idx];
    ag    = &borg_grids[y][x];

    /* Save the race */
    kill->r_idx = r_idx;

    /* Location */
    kill->ox = kill->pos.x = x;
    kill->oy = kill->pos.y = y;

    /* Games Index of the monster */
    kill->m_idx = m_ptr->midx;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = n;

    /* Timestamp */
    kill->when = borg_t;

    /* Mark the Morgoth time stamp if needed */
    if (kill->r_idx == borg_morgoth_id)
        borg_t_morgoth = borg_t;

    /* Update the monster */
    borg_update_kill_new(n);

    /* Update the monster */
    borg_update_kill_old(n);

    /* Note (r_info[kill->r_idx].name)*/
    borg_note(format(
        "# Creating a monster '%s' at (%d,%d), HP: %d, Time: %d, Index: %d",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, kill->power,
        kill->when, kill->r_idx));

    /* Recalculate danger */
    borg_danger_wipe = true;

    /* Remove Regional Fear which may have been induced from a non-LOS monster.
     * We assume this newly created monster is the one which induced our
     * Regional Fear.  If it wasn't, then the borg will create new Regional Fear
     * next time the unseen monster attacks.  There is no harm done by clearing
     * these. At most, he may end up resting in an area for 1 turn */
    if (borg_t < borg.need_see_invis + 5) {
        int y0, x0, y1, x1, y2, x2;

        y0 = (borg.c.y / 11);
        x0 = (borg.c.x / 11);

        /* Nearby regions */
        y1 = (y0 > 0) ? (y0 - 1) : 0;
        x1 = (x0 > 0) ? (x0 - 1) : 0;
        y2 = (x0 < 5) ? (x0 + 1) : 5;
        x2 = (x0 < 17) ? (x0 + 1) : 17;

        /* Remove "fear", spread around */
        borg_fear_region[y0][x0] = 0;
        borg_fear_region[y0][x1] = 0;
        borg_fear_region[y0][x2] = 0;
        borg_fear_region[y1][x0] = 0;
        borg_fear_region[y2][x0] = 0;
        borg_fear_region[y1][x1] = 0;
        borg_fear_region[y1][x2] = 0;
        borg_fear_region[y2][x1] = 0;
        borg_fear_region[y2][x2] = 0;
        borg_note(format("# Removing Regional Fear (%d,%d) because of a LOS %s",
            y, x, borg_race_name(kill->r_idx)));
    }

    /* Wipe goals only if I have some light source */
    if (borg.trait[BI_LIGHT]
        && borg_los(kill->pos.y, kill->pos.x, borg.c.y, borg.c.x))
        borg.goal.type = 0;

    /* Hack -- Force the monster to be sitting on a floor
     * grid unless that monster can pass through walls
     */
    if (!(rf_has(r_ptr->flags, RF_PASS_WALL))) {
        ag->feat = FEAT_FLOOR;
    }

    /* Hack -- Force the ghostly monster to be in a wall
     * grid until the grid is proven to be something else
     */
    if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
        ag->feat = FEAT_GRANITE;
    }

    /* Count up out list of Nasties */
    for (i = 0; i < borg_nasties_num; i++) {
        /* Count them up */
        if (r_info[kill->r_idx].d_char == borg_nasties[i])
            borg_nasties_count[i]++;
    }

    /* Return the monster */
    return n;
}